

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O2

ExprBase * __thiscall IntrusiveList<ExprBase>::operator[](IntrusiveList<ExprBase> *this,uint index)

{
  ExprBase *pEVar1;
  
  while( true ) {
    pEVar1 = this->head;
    if ((index == 0) || (pEVar1 == (ExprBase *)0x0)) break;
    this = (IntrusiveList<ExprBase> *)&pEVar1->next;
    index = index - 1;
  }
  if (index == 0) {
    return pEVar1;
  }
  __assert_fail("index == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x3f,"T *IntrusiveList<ExprBase>::operator[](unsigned int) const [T = ExprBase]");
}

Assistant:

T* operator[](unsigned index) const
	{
		T *curr = head;

		while(index && curr)
		{
			curr = curr->next;
			index--;
		}

		assert(index == 0);

		return curr;
	}